

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

NetAliasSymbol *
slang::ast::NetAliasSymbol::fromSyntax
          (ASTContext *parentContext,NetAliasSyntax *syntax,
          SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  uint uVar2;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *this;
  SourceLocation scope;
  NetAliasSymbol *this_00;
  Scope *this_01;
  NetType *in_RDX;
  SyntaxNode *in_RSI;
  string_view sVar3;
  NetAliasSymbol *result;
  IdentifierNameSyntax *ins;
  iterator __end4;
  iterator __begin4;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *__range4;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  ExpressionSyntax *expr;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  NetType *netType;
  Compilation *comp;
  ASTContext context;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb98;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffba0;
  Scope *in_stack_fffffffffffffba8;
  NetAliasSymbol *__range;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffbb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbb8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffbc0;
  NetType *in_stack_fffffffffffffbd0;
  NetSymbol *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe7;
  undefined4 in_stack_fffffffffffffc00;
  undefined1 *hash_00;
  string_view local_330;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_320;
  IdentifierNameSyntax *local_308;
  iterator local_300;
  iterator local_2f8;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *local_2f0;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_2e8 [2];
  ExpressionSyntax *local_2a8;
  const_iterator local_2a0;
  const_iterator local_290;
  SyntaxNode *local_280;
  NetType *local_278;
  Compilation *local_270;
  bitmask<slang::ast::ASTFlags> local_258 [25];
  undefined1 local_190 [40];
  ulong local_168;
  ulong local_160;
  NetType *local_150;
  SyntaxNode *local_148;
  string_view *local_138;
  undefined1 *local_130;
  string_view *local_128;
  undefined1 *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_88;
  size_t local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  string_view *local_70;
  undefined1 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  undefined1 *local_8;
  
  local_150 = in_RDX;
  local_148 = in_RSI;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              *)in_stack_fffffffffffffbb0.m_bits);
  bitmask<slang::ast::ASTFlags>::bitmask(local_258,NonProcedural);
  ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0);
  local_270 = ASTContext::getCompilation((ASTContext *)0x3efa4a);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x3efa71);
  local_278 = Scope::getDefaultNetType(in_stack_fffffffffffffba8);
  local_280 = local_148 + 4;
  local_290 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x3efac3);
  local_2a0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x3efb02);
  do {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffba0,
                       (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)
                       in_stack_fffffffffffffb98);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      scope = parsing::Token::location((Token *)&local_148[3].parent);
      this_00 = BumpAllocator::emplace<slang::ast::NetAliasSymbol,slang::SourceLocation>
                          ((BumpAllocator *)in_stack_fffffffffffffbb0.m_bits,
                           (SourceLocation *)in_stack_fffffffffffffba8);
      Symbol::setSyntax(&this_00->super_Symbol,local_148);
      __range = this_00;
      this_01 = not_null<const_slang::ast::Scope_*>::operator*
                          ((not_null<const_slang::ast::Scope_*> *)0x3f02a5);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)this_01,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
      syntax_00._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffffbe0;
      syntax_00._M_ptr = (pointer)in_stack_fffffffffffffbd8;
      syntax_00._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffbe7;
      Symbol::setAttributes(&in_stack_fffffffffffffbd0->super_Symbol,(Scope *)scope,syntax_00);
      SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                   *)0x3f0300);
      return this_00;
    }
    local_2a8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                             *)0x3efb71);
    bVar1 = NetType::isError(local_278);
    if (!bVar1) {
      SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL>::SmallVector
                ((SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *)0x3efbc7);
      Expression::findPotentiallyImplicitNets
                ((SyntaxNode *)in_stack_fffffffffffffbb0.m_bits,
                 (ASTContext *)in_stack_fffffffffffffba8,
                 (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)
                 in_stack_fffffffffffffba0);
      local_2f0 = local_2e8;
      local_2f8 = SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::begin(local_2f0);
      local_300 = SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::end(local_2f0);
      for (; local_2f8 != local_300; local_2f8 = local_2f8 + 1) {
        local_308 = *local_2f8;
        hash_00 = local_190;
        sVar3 = parsing::Token::valueText((Token *)in_stack_fffffffffffffbb0.m_bits);
        local_138 = &local_330;
        local_130 = hash_00;
        local_128 = local_138;
        local_120 = hash_00;
        local_70 = local_138;
        local_68 = hash_00;
        local_330 = sVar3;
        local_78 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                   ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                             ((basic_string_view<char,_std::char_traits<char>_> *)0x3efd19);
        local_80 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        this = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                  ::position_for(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
        local_10 = local_78;
        local_20 = local_80;
        local_88 = this;
        local_18 = this;
        local_8 = hash_00;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,(size_t)this);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                               *)0x3efe10);
          local_40 = local_40 + local_38;
          uVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
          local_44 = uVar2;
          if (uVar2 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                       ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                                   *)0x3efe69);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)0x3efeb9);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_string_view<char,_std::char_traits<char>_> *)0x3efee6);
              bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffbb0.m_bits);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                goto LAB_003effed;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_fffffffffffffbe7 =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
          if ((bool)in_stack_fffffffffffffbe7) {
            memset(&local_a0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_a0);
            goto LAB_003effed;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(hash_00 + 0x10));
        } while (bVar1);
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_a0);
LAB_003effed:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_a0);
        if (bVar1) {
          local_b0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::make_iterator((locator *)0x3f000f);
          local_b1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_320,&local_b0,&local_b1);
        }
        else if (local_160 < local_168) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                    (in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8,
                     in_stack_fffffffffffffbb0.m_bits,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffba8);
          local_c8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::make_iterator((locator *)0x3f0097);
          local_e1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_320,&local_c8,local_e1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                    (this,(size_t)hash_00,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(uVar2,in_stack_fffffffffffffc00));
          local_f8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     ::make_iterator((locator *)0x3f0102);
          local_111[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_320,&local_f8,local_111);
        }
        if ((local_320.second & 1U) != 0) {
          in_stack_fffffffffffffbd0 = local_150;
          in_stack_fffffffffffffbd8 =
               NetSymbol::createImplicit
                         ((Compilation *)
                          CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                          (IdentifierNameSyntax *)in_stack_fffffffffffffbd8,local_150);
          SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffba0,
                     (Symbol **)in_stack_fffffffffffffb98);
        }
      }
      SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> *)0x3f0206);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffba0);
  } while( true );
}

Assistant:

NetAliasSymbol& NetAliasSymbol::fromSyntax(const ASTContext& parentContext,
                                           const syntax::NetAliasSyntax& syntax,
                                           SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> seenNames;
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& comp = context.getCompilation();
    auto& netType = context.scope->getDefaultNetType();

    for (auto expr : syntax.nets) {
        // If not explicitly disabled check for implicit nets.
        if (!netType.isError()) {
            SmallVector<const IdentifierNameSyntax*> implicitNetNames;
            Expression::findPotentiallyImplicitNets(*expr, context, implicitNetNames);

            for (auto ins : implicitNetNames) {
                if (seenNames.emplace(ins->identifier.valueText()).second)
                    implicitNets.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
            }
        }
    }

    auto result = comp.emplace<NetAliasSymbol>(syntax.keyword.location());
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);
    return *result;
}